

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O0

void Npn_ManWrite(Npn_Man_t *p,char *pFileName)

{
  word wVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  Vec_Ptr_t *p_00;
  word *Sign;
  int local_34;
  int i;
  FILE *pFile;
  Npn_Obj_t *pEntry;
  Vec_Ptr_t *vEntries;
  char *pFileName_local;
  Npn_Man_t *p_local;
  
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open NPN function file \"%s\".\n",pFileName);
  }
  else {
    p_00 = Vec_PtrAlloc(p->nEntries);
    for (local_34 = 0; local_34 < p->nBins; local_34 = local_34 + 1) {
      for (pFile = (FILE *)Npn_ManObj(p,p->pBins[local_34]); pFile != (FILE *)0x0;
          pFile = (FILE *)Npn_ManObj(p,*(int *)((long)&pFile->_IO_read_ptr + 4))) {
        Vec_PtrPush(p_00,pFile);
      }
    }
    Vec_PtrSort(p_00,Npn_ManCompareEntries);
    for (local_34 = 0; iVar2 = Vec_PtrSize(p_00), local_34 < iVar2; local_34 = local_34 + 1) {
      Sign = (word *)Vec_PtrEntry(p_00,local_34);
      Extra_PrintHexadecimal((FILE *)__stream,(uint *)Sign,6);
      wVar1 = Sign[1];
      uVar3 = Npn_TruthSuppSize(*Sign,6);
      fprintf(__stream," %d %d\n",(ulong)(uint)wVar1,(ulong)uVar3);
    }
    fclose(__stream);
    Vec_PtrFree(p_00);
  }
  return;
}

Assistant:

void Npn_ManWrite( Npn_Man_t * p, char * pFileName )
{
    Vec_Ptr_t * vEntries;
    Npn_Obj_t * pEntry;
    FILE * pFile = fopen( pFileName, "w" );
    int i;
    if ( pFile == NULL )
    {
        Abc_Print( -1, "Cannot open NPN function file \"%s\".\n", pFileName );
        return;
    }
    vEntries = Vec_PtrAlloc( p->nEntries );
    for ( i = 0; i < p->nBins; i++ )
        for ( pEntry = Npn_ManObj(p, p->pBins[i]); pEntry; pEntry = Npn_ManObj(p, pEntry->iNext) )
            Vec_PtrPush( vEntries, pEntry );
    Vec_PtrSort( vEntries, (int (*)())Npn_ManCompareEntries );
    Vec_PtrForEachEntry( Npn_Obj_t *, vEntries, pEntry, i )
    {
        Extra_PrintHexadecimal( pFile, (unsigned *)&pEntry->uTruth, 6 );
        fprintf( pFile, " %d %d\n", pEntry->Count, Npn_TruthSuppSize(pEntry->uTruth, 6) );
    }
    fclose( pFile );
    Vec_PtrFree( vEntries );
}